

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Liby::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
pop_wait(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
        BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _List_node_base *p_Var1;
  value_type *t;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  this_00 = &this->queue_;
  p_Var1 = (this->queue_).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)this_00) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cond_);
      p_Var1 = (this_00->
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 == (_List_node_base *)this_00);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,p_Var1[1]._M_next,
             (long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var1[1]._M_next);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(this_00,(this_00->
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

T pop_wait() {
        std::unique_lock<std::mutex> lck(mutex_);
        cond_.wait(lck, [this] { return !queue_.empty(); });
        return pop_front_imp();
    }